

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::capitalized_type_name_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this)

{
  Type TVar1;
  LogMessage *other;
  char *pcVar2;
  LogFinisher local_49;
  LogMessage local_48;
  
  TVar1 = FieldDescriptor::type(this->descriptor_);
  switch(TVar1) {
  case TYPE_DOUBLE:
    pcVar2 = "Double";
    break;
  case TYPE_FLOAT:
    pcVar2 = "Float";
    break;
  case TYPE_INT64:
    pcVar2 = "Int64";
    break;
  case TYPE_UINT64:
    pcVar2 = "UInt64";
    break;
  case TYPE_INT32:
    pcVar2 = "Int32";
    break;
  case TYPE_FIXED64:
    pcVar2 = "Fixed64";
    break;
  case TYPE_FIXED32:
    pcVar2 = "Fixed32";
    break;
  case TYPE_BOOL:
    pcVar2 = "Bool";
    break;
  case TYPE_STRING:
    pcVar2 = "String";
    break;
  case TYPE_GROUP:
    pcVar2 = "Group";
    break;
  case TYPE_MESSAGE:
    pcVar2 = "Message";
    break;
  case TYPE_BYTES:
    pcVar2 = "Bytes";
    break;
  case TYPE_UINT32:
    pcVar2 = "UInt32";
    break;
  case TYPE_ENUM:
    pcVar2 = "Enum";
    break;
  case TYPE_SFIXED32:
    pcVar2 = "SFixed32";
    break;
  case TYPE_SFIXED64:
    pcVar2 = "SFixed64";
    break;
  case TYPE_SINT32:
    pcVar2 = "SInt32";
    break;
  case MAX_TYPE:
    pcVar2 = "SInt64";
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x1b5);
    other = internal::LogMessage::operator<<(&local_48,"Unknown field type.");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
    pcVar2 = "";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::capitalized_type_name() {
  switch (descriptor_->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return "Enum";
    case FieldDescriptor::TYPE_MESSAGE:
      return "Message";
    case FieldDescriptor::TYPE_GROUP:
      return "Group";
    case FieldDescriptor::TYPE_DOUBLE:
      return "Double";
    case FieldDescriptor::TYPE_FLOAT:
      return "Float";
    case FieldDescriptor::TYPE_INT64:
      return "Int64";
    case FieldDescriptor::TYPE_UINT64:
      return "UInt64";
    case FieldDescriptor::TYPE_INT32:
      return "Int32";
    case FieldDescriptor::TYPE_FIXED64:
      return "Fixed64";
    case FieldDescriptor::TYPE_FIXED32:
      return "Fixed32";
    case FieldDescriptor::TYPE_BOOL:
      return "Bool";
    case FieldDescriptor::TYPE_STRING:
      return "String";
    case FieldDescriptor::TYPE_BYTES:
      return "Bytes";
    case FieldDescriptor::TYPE_UINT32:
      return "UInt32";
    case FieldDescriptor::TYPE_SFIXED32:
      return "SFixed32";
    case FieldDescriptor::TYPE_SFIXED64:
      return "SFixed64";
    case FieldDescriptor::TYPE_SINT32:
      return "SInt32";
    case FieldDescriptor::TYPE_SINT64:
      return "SInt64";
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return "";
  }
}